

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.c
# Opt level: O3

void apprun_file_copy(char *source_path,char *target_path)

{
  long *plVar1;
  uint uVar2;
  FILE *__stream;
  FILE *__stream_00;
  ulong extraout_RAX;
  ulong uVar3;
  void *pvVar4;
  long lVar5;
  long lVar6;
  size_t __nmemb;
  
  __stream = fopen(source_path,"r");
  __stream_00 = fopen(target_path,"w");
  if (__stream != (FILE *)0x0) {
    if (__stream_00 != (FILE *)0x0) goto LAB_0010626c;
    apprun_file_copy_cold_1();
    uVar3 = extraout_RAX;
    do {
      fputc((int)uVar3,__stream_00);
LAB_0010626c:
      uVar2 = fgetc(__stream);
      uVar3 = (ulong)uVar2;
    } while (uVar2 != 0xffffffff);
    fclose(__stream);
    fclose(__stream_00);
    return;
  }
  apprun_file_copy_cold_2();
  if ((long *)source_path == (long *)0x0) {
    calloc(1,8);
  }
  else {
    if (*(long *)source_path == 0) {
      __nmemb = 1;
    }
    else {
      uVar3 = 1;
      do {
        plVar1 = (long *)((long)source_path + uVar3 * 8);
        uVar3 = uVar3 + 1;
      } while (*plVar1 != 0);
      __nmemb = uVar3 & 0xffffffff;
    }
    pvVar4 = calloc(__nmemb,8);
    if (((long *)source_path != (long *)0x0) && (lVar5 = *(long *)source_path, lVar5 != 0)) {
      lVar6 = 0;
      do {
        *(long *)((long)pvVar4 + lVar6) = lVar5;
        lVar5 = *(long *)((long)source_path + lVar6 + 8);
        lVar6 = lVar6 + 8;
      } while (lVar5 != 0);
    }
  }
  free(source_path);
  return;
}

Assistant:

void apprun_file_copy(const char *source_path, const char *target_path) {
    FILE *source, *target;

    source = fopen(source_path, "r");
    target = fopen(target_path, "w");

    if (source == NULL) {
        fprintf(stderr, "Unable to read file: %s\n", source_path);
        exit(1);
    }

    if (target == NULL) {
        fprintf(stderr, "Unable to write file: %s\n", target_path);
        exit(1);
    }


    int ch;
    while ((ch = fgetc(source)) != EOF)
        fputc(ch, target);

    fclose(source);
    fclose(target);
}